

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
ColColDAGNode::ColColDAGNode(ColColDAGNode *this,int op,DAGNode *left,DAGNode *right)

{
  (this->super_DAGNode)._vptr_DAGNode = (_func_int **)&PTR__ColColDAGNode_00107c70;
  this->op_ = op;
  this->right_ = right;
  (this->right_col_name_)._M_dataplus._M_p = (pointer)&(this->right_col_name_).field_2;
  (this->right_col_name_)._M_string_length = 0;
  (this->right_col_name_).field_2._M_local_buf[0] = '\0';
  this->left_ = left;
  (this->left_col_name_)._M_dataplus._M_p = (pointer)&(this->left_col_name_).field_2;
  (this->left_col_name_)._M_string_length = 0;
  (this->left_col_name_).field_2._M_local_buf[0] = '\0';
  this->left_vec_ = (DbVector *)0x0;
  this->right_vec_ = (DbVector *)0x0;
  assignPrimitive_(this);
  return;
}

Assistant:

ColColDAGNode(int op, DAGNode* left, DAGNode* right) :
        op_(op), right_(right), left_(left), left_vec_(nullptr), right_vec_(nullptr) {
        assignPrimitive_();
    }